

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O2

void gimage::extractContours
               (vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *pl,ImageU8 *image,
               float tolerance)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  long lVar5;
  long lVar6;
  long i;
  long lVar7;
  long lVar8;
  byte bVar9;
  Polygon p;
  ImageU8 mask;
  byte bVar10;
  
  lVar8 = image->width;
  lVar4 = image->height;
  bVar10 = 0;
  bVar9 = 0;
  lVar3 = 0;
  if (0 < lVar8) {
    lVar3 = lVar8;
  }
  lVar5 = 0;
  if (0 < lVar4) {
    lVar5 = lVar4;
  }
  for (lVar6 = 0; lVar6 != lVar5; lVar6 = lVar6 + 1) {
    for (lVar7 = 0; lVar3 != lVar7; lVar7 = lVar7 + 1) {
      bVar9 = (*image->img)[lVar6][lVar7];
      if ((*image->img)[lVar6][lVar7] < bVar10) {
        bVar9 = bVar10;
      }
      bVar10 = bVar9;
    }
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image(&mask,lVar8,lVar4,1);
  __n = -mask.n;
  if (0 < mask.n) {
    __n = mask.n;
  }
  memset(mask.pixel,0,__n);
  for (lVar8 = 0; lVar8 < image->height; lVar8 = lVar8 + 1) {
    bVar2 = false;
    for (lVar4 = 0; lVar4 < image->width; lVar4 = lVar4 + 1) {
      p.vertex.
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      p.vertex.
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      p.vertex.
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((*image->img)[lVar8][lVar4] == bVar9) {
        if ((!bVar2) && (bVar2 = true, (*mask.img)[lVar8][lVar4] == '\0')) {
          extractContour(&p,&mask,image,lVar4,lVar8,0);
          bVar1 = Polygon::isClosed(&p,1.5);
          if (bVar1) {
            if (0.0 <= tolerance) {
              Polygon::reduce(&p,tolerance);
            }
            std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::push_back
                      (pl,(value_type *)&p);
          }
        }
      }
      else if (bVar2) {
        if ((*mask.img)[lVar8][lVar4 + -1] == '\0') {
          extractContour(&p,&mask,image,lVar4 + -1,lVar8,4);
          bVar2 = Polygon::isClosed(&p,1.5);
          if (bVar2) {
            if (0.0 <= tolerance) {
              Polygon::reduce(&p,tolerance);
            }
            std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::push_back
                      (pl,(value_type *)&p);
          }
        }
        bVar2 = false;
      }
      std::_Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
      ~_Vector_base((_Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                     *)&p);
    }
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&mask);
  return;
}

Assistant:

void extractContours(std::vector<Polygon> &pl, const ImageU8 &image, float tolerance)
{
  uint8_t fg=0;

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      fg=std::max(fg, image.get(i, k));
    }
  }

  ImageU8 mask(image.getWidth(), image.getHeight(), 1);
  mask.clear();

  for (long y=0; y<image.getHeight(); y++)
  {
    bool inside=false;
    for (long x=0; x<image.getWidth(); x++)
    {
      Polygon p;

      if (image.get(x, y) == fg && !inside)
      {
        if (mask.get(x, y) == 0)
        {
          extractContour(p, mask, image, x, y, 0);

          if (p.isClosed())
          {
            if (tolerance >= 0)
            {
              p.reduce(tolerance);
            }

            pl.push_back(p);
          }
        }

        inside=true;
      }
      else if (image.get(x, y) != fg && inside)
      {
        if (mask.get(x-1, y) == 0)
        {
          extractContour(p, mask, image, x-1, y, 4);

          if (p.isClosed())
          {
            if (tolerance >= 0)
            {
              p.reduce(tolerance);
            }

            pl.push_back(p);
          }
        }

        inside=false;
      }
    }
  }
}